

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::MemGrow(w3Interp *this)

{
  uint32_t uVar1;
  value_type_conflict2 local_31;
  size_type local_30;
  size_t new_size;
  size_t page_growth;
  size_t previous_size;
  w3Interp *pwStack_10;
  int32_t result;
  w3Interp *this_local;
  
  previous_size._4_4_ = 0xffffffff;
  pwStack_10 = this;
  page_growth = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (&this->module_instance->memory);
  uVar1 = w3Stack::pop_u32(&this->super_w3Stack);
  new_size = (size_t)uVar1;
  if (new_size == 0) {
    previous_size._4_4_ = (int32_t)(page_growth >> 0x10);
  }
  else {
    local_30 = page_growth + new_size * 0x10000;
    local_31 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->module_instance->memory,local_30,&local_31);
    previous_size._4_4_ = (int32_t)(page_growth >> 0x10);
  }
  w3Stack::push_i32(&this->super_w3Stack,previous_size._4_4_);
  return;
}

Assistant:

INTERP (MemGrow)
{
    //__debugbreak ();
    int32_t result = -1;
    const size_t previous_size = module_instance->memory.size ();
    const size_t page_growth = pop_u32 ();
    if (page_growth == 0)
    {
        result = (int32_t)(previous_size >> PageShift);
    }
    else
    {
        const size_t new_size = previous_size + (page_growth << PageShift);
        try
        {
            module_instance->memory.resize (new_size, 0);
            result = (int32_t)(previous_size >> PageShift);
        }
        catch (...)
        {
        }
    }
    push_i32 (result);
}